

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VMContext.cpp
# Opt level: O1

void Lodtalk::setCurrentContext(VMContext *context)

{
  VMContext *pVVar1;
  long lVar2;
  GarbageCollector *pGVar3;
  
  lVar2 = __tls_get_addr(&PTR_00165988);
  pVVar1 = *(VMContext **)(lVar2 + 8);
  *(VMContext **)(lVar2 + 8) = context;
  if (pVVar1 != context) {
    if (pVVar1 != (VMContext *)0x0) {
      pGVar3 = MemoryManager::getGarbageCollector(pVVar1->memoryManager);
      GarbageCollector::unregisterThreadForGC(pGVar3);
    }
    if (context != (VMContext *)0x0) {
      pGVar3 = MemoryManager::getGarbageCollector(context->memoryManager);
      GarbageCollector::registerThreadForGC(pGVar3);
      return;
    }
  }
  return;
}

Assistant:

LODTALK_VM_EXPORT void setCurrentContext(VMContext *context)
{
    auto oldContext = currentContext;
    currentContext = context;

    if(oldContext != context)
    {
        if(oldContext)
            oldContext->unregisterThreadForGC();
        if(context)
            context->registerThreadForGC();
    }
}